

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functors.h
# Opt level: O2

float __thiscall cnn::FBinaryLogLoss::operator()(FBinaryLogLoss *this,float x,float x_true)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = x;
  auVar7 = auVar10._0_16_;
  if (x_true == 1.0) {
    auVar9._0_12_ = ZEXT412(0);
    auVar9._12_4_ = 0;
    uVar1 = vcmpss_avx512f(auVar7,auVar9,0);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar11._0_4_ = logf((float)((uint)bVar2 * 0x800000 + (uint)!bVar2 * (int)x));
    auVar11._4_60_ = extraout_var;
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar11._0_16_,auVar3);
    fVar8 = auVar7._0_4_;
  }
  else if (x_true == 0.0) {
    uVar1 = vcmpss_avx512f(auVar7,ZEXT416(0x3f800000),0);
    bVar2 = (bool)((byte)uVar1 & 1);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar7,auVar4);
    auVar12._0_4_ = log1pf((float)((uint)bVar2 * -0x7f800000 + (uint)!bVar2 * auVar7._0_4_));
    auVar12._4_60_ = extraout_var_00;
    auVar6._4_4_ = in_XMM1_Db;
    auVar6._0_4_ = x_true;
    auVar6._8_4_ = in_XMM1_Dc;
    auVar6._12_4_ = in_XMM1_Dd;
    auVar7 = vfmsub213ss_fma(auVar6,auVar12._0_16_,auVar12._0_16_);
    fVar8 = auVar7._0_4_;
  }
  else {
    if ((x == 0.0) || (x == 1.0)) {
      auVar7 = SUB6416(ZEXT464(0x800000),0);
    }
    fVar8 = logf(auVar7._0_4_);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar7,auVar5);
    auVar13._0_4_ = log1pf(auVar7._0_4_);
    auVar13._4_60_ = extraout_var_01;
    auVar7._4_4_ = in_XMM1_Db;
    auVar7._0_4_ = x_true;
    auVar7._8_4_ = in_XMM1_Dc;
    auVar7._12_4_ = in_XMM1_Dd;
    auVar7 = vfmsub213ss_fma(auVar7,ZEXT416((uint)(auVar13._0_4_ - fVar8)),auVar13._0_16_);
    fVar8 = auVar7._0_4_;
  }
  return fVar8;
}

Assistant:

CNN_DEVICE_FUNC inline float operator()(float x, float x_true) const {
    if (x_true == 1.f) {
      if (x == 0.f) x = CNN_DEVICE_MIN;
      return -1.f * x_true * log(x);
    }
    else if (x_true == 0.f) {
      if (x == 1.f) x = CNN_DEVICE_MIN;
      return (x_true - 1.f) * log1p(-x);
    }
    else {
      if (x == 0.f) x = CNN_DEVICE_MIN;
      if (x == 1.f) x = CNN_DEVICE_MIN;
      return -1.f * (x_true * log(x) + (1.f - x_true) * log1p(-x));
    }
  }